

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

Value * __thiscall
duckdb::Appender::GetDefaultValue(Value *__return_storage_ptr__,Appender *this,idx_t column)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pcVar3;
  reference pvVar4;
  iterator iVar5;
  pointer pTVar6;
  reference this_00;
  string *psVar7;
  NotImplementedException *this_01;
  InvalidInputException *this_02;
  idx_t index;
  idx_t local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pLVar1 = (this->column_ids).
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->column_ids).
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_70 = column;
  if (pLVar1 != pLVar2) {
    if ((ulong)((long)pLVar2 - (long)pLVar1 >> 3) <= column) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Column index out of bounds","");
      InvalidInputException::InvalidInputException(this_02,&local_68);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar4 = vector<duckdb::LogicalIndex,_true>::operator[](&this->column_ids,column);
    local_70 = pvVar4->index;
  }
  iVar5 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::Value>,_std::allocator<std::pair<const_unsigned_long,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->default_values)._M_h,&local_70);
  if (iVar5.super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::Value>,_false>._M_cur
      != (__node_type *)0x0) {
    Value::Value(__return_storage_ptr__,
                 (Value *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::Value>,_false>
                                 ._M_cur + 0x10));
    return __return_storage_ptr__;
  }
  pTVar6 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(&this->description);
  this_00 = vector<duckdb::ColumnDefinition,_true>::operator[](&pTVar6->columns,local_70);
  psVar7 = ColumnDefinition::Name_abi_cxx11_(this_00);
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "AppendDefault is not supported for column \"%s\": not a foldable default expressions."
             ,"");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + psVar7->_M_string_length);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_01,&local_68,&local_48);
  __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Value Appender::GetDefaultValue(idx_t column) {
	auto index = column;

	if (!column_ids.empty()) {
		if (column >= column_ids.size()) {
			throw InvalidInputException("Column index out of bounds");
		}
		index = column_ids[column].index;
	}

	auto it = default_values.find(index);
	if (it == default_values.end()) {
		auto &name = description->columns[index].Name();
		throw NotImplementedException(
		    "AppendDefault is not supported for column \"%s\": not a foldable default expressions.", name);
	}
	return it->second;
}